

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_output_auth(connectdata *conn,char *request,char *path,_Bool proxytunnel)

{
  Curl_easy *pCVar1;
  int iVar2;
  auth *authstatus;
  auth *authstatus_00;
  auth *authproxy;
  auth *authhost;
  Curl_easy *data;
  CURLcode result;
  _Bool proxytunnel_local;
  char *path_local;
  char *request_local;
  connectdata *conn_local;
  
  data._0_4_ = CURLE_OK;
  pCVar1 = conn->data;
  authstatus = &(pCVar1->state).authhost;
  authstatus_00 = &(pCVar1->state).authproxy;
  if (((((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) ||
       ((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) == 0)) &&
      ((*(uint *)&(conn->bits).field_0x4 >> 7 & 1) == 0)) && (conn->oauth_bearer == (char *)0x0)) {
    (pCVar1->state).authhost.field_0x18 = (pCVar1->state).authhost.field_0x18 & 0xfe | 1;
    (pCVar1->state).authproxy.field_0x18 = (pCVar1->state).authproxy.field_0x18 & 0xfe | 1;
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if ((authstatus->want != 0) && ((pCVar1->state).authhost.picked == 0)) {
      (pCVar1->state).authhost.picked = authstatus->want;
    }
    if ((authstatus_00->want != 0) && ((pCVar1->state).authproxy.picked == 0)) {
      (pCVar1->state).authproxy.picked = authstatus_00->want;
    }
    if (((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) ||
       ((*(uint *)&(conn->bits).field_0x4 >> 0xe & 1) != (uint)proxytunnel)) {
      (pCVar1->state).authproxy.field_0x18 = (pCVar1->state).authproxy.field_0x18 & 0xfe | 1;
    }
    else {
      data._0_4_ = output_auth_headers(conn,authstatus_00,request,path,true);
      if ((CURLcode)data != CURLE_OK) {
        return (CURLcode)data;
      }
    }
    if (((((*(ushort *)&(pCVar1->state).field_0x4e4 >> 1 & 1) == 0) ||
         ((*(uint *)&(conn->bits).field_0x4 >> 0x14 & 1) != 0)) ||
        ((pCVar1->state).first_host == (char *)0x0)) ||
       (((*(ulong *)&(pCVar1->set).field_0x878 >> 0x18 & 1) != 0 ||
        (iVar2 = Curl_strcasecompare((pCVar1->state).first_host,(conn->host).name), iVar2 != 0)))) {
      data._0_4_ = output_auth_headers(conn,authstatus,request,path,false);
    }
    else {
      (pCVar1->state).authhost.field_0x18 = (pCVar1->state).authhost.field_0x18 & 0xfe | 1;
    }
    conn_local._4_4_ = (CURLcode)data;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode
Curl_http_output_auth(struct connectdata *conn,
                      const char *request,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if((conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
     conn->bits.user_passwd || conn->oauth_bearer)
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
     (conn->bits.tunnel_proxy == (bit)proxytunnel)) {
    result = output_auth_headers(conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original
     host due to a location-follow, we do some weirdo checks here */
  if(!data->state.this_is_a_follow ||
     conn->bits.netrc ||
     !data->state.first_host ||
     data->set.allow_auth_to_other_hosts ||
     strcasecompare(data->state.first_host, conn->host.name)) {
    result = output_auth_headers(conn, authhost, request, path, FALSE);
  }
  else
    authhost->done = TRUE;

  return result;
}